

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O2

void __thiscall DynamicGraph::buildBFSStructure(DynamicGraph *this,Vertex *s)

{
  AdjList *g;
  size_type __n;
  vec_adj_list_impl<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *g_;
  _Bit_iterator _Var1;
  reference rVar2;
  size_type local_80;
  vector<bool,_std::allocator<bool>_> visited;
  undefined4 local_50 [8];
  
  std::vector<bool,_std::allocator<bool>_>::vector
            (&visited,(long)(this->super_UndirectedGraph).super_type.m_vertices.
                            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_UndirectedGraph).super_type.m_vertices.
                            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5,
             (allocator_type *)local_50);
  this->nextComponent = this->nextComponent + 1;
  bfs(this,s,&visited,0);
  while( true ) {
    local_50[0] = 0;
    g_ = (vec_adj_list_impl<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
          *)local_50;
    _Var1 = std::__find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                       visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                       visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
    __n = 1;
    if ((_Var1.super__Bit_iterator_base._M_p ==
         visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_p) &&
       (_Var1.super__Bit_iterator_base._M_offset ==
        visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset)) break;
    while (local_80 = __n,
          __n < (ulong)((long)(this->level).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->level).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3)) {
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited,__n);
      if ((*rVar2._M_p & rVar2._M_mask) == 0) {
        boost::
        add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                  ((pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool>
                    *)local_50,(boost *)0x0,local_80,(vertex_descriptor)this,g_);
        boost::
        edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                  ((pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool>
                    *)local_50,(boost *)0x0,local_80,(vertex_descriptor)this,
                   (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
                    *)g_);
        std::
        _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
        ::_M_insert_unique<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>
                  ((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
                    *)&this->virtualEdges,
                   (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)local_50);
        this->nextComponent = this->nextComponent + 1;
        bfs(this,&local_80,&visited,1);
      }
      __n = local_80 + 1;
    }
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&visited.super__Bvector_base<std::allocator<bool>_>);
  return;
}

Assistant:

void DynamicGraph::buildBFSStructure(const Vertex &s)
{
    std::vector<bool> visited(boost::num_vertices(*this));
    this->nextComponent++;
    this->bfs(s, visited, 0);

    // While not visited notes exist
    while(std::find(visited.begin(), visited.end(), 0) != visited.end() ) {
        // For each note not visited yet
        for(Vertex i=1; i<level.size(); ++i ) {
            // Add a virtual edge
            if(!visited[i]){
                boost::add_edge(0, i, *this);
                this->virtualEdges.insert(edge(0,i,*this).first);
                this->nextComponent++;

                // And continue scanning from here
                this->bfs(i, visited, 1);
            }
        }
    }
}